

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  Value *pVVar3;
  ValueHolder *pVVar4;
  size_t sVar5;
  size_t sVar6;
  TokenType TVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  _Elt_pointer ppVVar11;
  byte unaff_R13B;
  ushort uVar12;
  Value numberName;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  ValueHolder local_f0;
  ushort local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  string local_c8;
  Token local_a8;
  string local_90;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  size_t sStack_58;
  size_t local_50;
  Token local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  uVar12 = local_68 & 0xfe00;
  local_68 = uVar12 + 7;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  pcVar10 = (char *)operator_new(0x30);
  pcVar10[0x10] = '\0';
  pcVar10[0x11] = '\0';
  pcVar10[0x12] = '\0';
  pcVar10[0x13] = '\0';
  pcVar10[0x14] = '\0';
  pcVar10[0x15] = '\0';
  pcVar10[0x16] = '\0';
  pcVar10[0x17] = '\0';
  pcVar10[0x18] = '\0';
  pcVar10[0x19] = '\0';
  pcVar10[0x1a] = '\0';
  pcVar10[0x1b] = '\0';
  pcVar10[0x1c] = '\0';
  pcVar10[0x1d] = '\0';
  pcVar10[0x1e] = '\0';
  pcVar10[0x1f] = '\0';
  pcVar10[0x20] = '\0';
  pcVar10[0x21] = '\0';
  pcVar10[0x22] = '\0';
  pcVar10[0x23] = '\0';
  pcVar10[0x24] = '\0';
  pcVar10[0x25] = '\0';
  pcVar10[0x26] = '\0';
  pcVar10[0x27] = '\0';
  pcVar10[0x28] = '\0';
  pcVar10[0x29] = '\0';
  pcVar10[0x2a] = '\0';
  pcVar10[0x2b] = '\0';
  pcVar10[0x2c] = '\0';
  pcVar10[0x2d] = '\0';
  pcVar10[0x2e] = '\0';
  pcVar10[0x2f] = '\0';
  pcVar10[0] = '\0';
  pcVar10[1] = '\0';
  pcVar10[2] = '\0';
  pcVar10[3] = '\0';
  pcVar10[4] = '\0';
  pcVar10[5] = '\0';
  pcVar10[6] = '\0';
  pcVar10[7] = '\0';
  pcVar10[8] = '\0';
  pcVar10[9] = '\0';
  pcVar10[10] = '\0';
  pcVar10[0xb] = '\0';
  pcVar10[0xc] = '\0';
  pcVar10[0xd] = '\0';
  pcVar10[0xe] = '\0';
  pcVar10[0xf] = '\0';
  *(char **)(pcVar10 + 0x18) = pcVar10 + 8;
  *(char **)(pcVar10 + 0x20) = pcVar10 + 8;
  pcVar10[0x28] = '\0';
  pcVar10[0x29] = '\0';
  pcVar10[0x2a] = '\0';
  pcVar10[0x2b] = '\0';
  pcVar10[0x2c] = '\0';
  pcVar10[0x2d] = '\0';
  pcVar10[0x2e] = '\0';
  pcVar10[0x2f] = '\0';
  ppVVar11 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar11 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar11 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar3 = ppVVar11[-1];
  uVar2 = *(ushort *)&pVVar3->field_0x8;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xff00 | 7;
  local_70.map_ = *(ObjectValues **)&pVVar3->value_;
  (pVVar3->value_).string_ = pcVar10;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xfe00 | 7;
  local_68 = uVar2 & 0x100 | uVar12 | uVar2 & 0xff;
  sVar5 = pVVar3->start_;
  sVar6 = pVVar3->limit_;
  pVVar3->start_ = sStack_58;
  pVVar3->limit_ = local_50;
  sStack_58 = sVar5;
  local_50 = sVar6;
  Value::~Value((Value *)&local_70);
  ppVVar11 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar11 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar11 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar11[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  do {
    readToken(this,&local_48);
    while (TVar7 = local_48.type_, local_48.type_ == tokenComment) {
      readToken(this,&local_48);
    }
    if ((local_48.type_ == tokenObjectEnd) && ((char *)local_c8._M_string_length == (char *)0x0)) {
LAB_0010e870:
      unaff_R13B = 1;
      iVar9 = 1;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x11adae);
      iVar9 = 3;
      if (TVar7 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ == true) {
          local_e8 = local_e8 & 0xfe00;
          local_e0._M_allocated_capacity = 0;
          local_e0._8_8_ = 0;
          local_d0 = 0;
          bVar8 = decodeNumber(this,&local_48,(Value *)&local_f0);
          if (bVar8) {
            Value::asString_abi_cxx11_(&local_90,(Value *)&local_f0);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
                &local_90.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                       (int)local_90._M_dataplus._M_p));
            }
          }
          else {
            recoverFromError(this,tokenObjectEnd);
            unaff_R13B = 0;
          }
          Value::~Value((Value *)&local_f0);
          iVar9 = 1;
          if (bVar8) goto LAB_0010e740;
        }
      }
      else if (TVar7 == tokenString) {
        bVar8 = decodeString(this,&local_48,&local_c8);
        if (bVar8) {
LAB_0010e740:
          readToken(this,(Token *)&local_90);
          if ((int)local_90._M_dataplus._M_p == 0xb) {
            ppVVar11 = (this->nodes_).c.
                       super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar11 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar11 = (this->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            local_f0.map_ =
                 (ObjectValues *)
                 Value::resolveReference(ppVVar11[-1],local_c8._M_dataplus._M_p,false);
            pVVar4 = (ValueHolder *)
                     (this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pVVar4 == (ValueHolder *)
                          ((this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
              std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                        ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                         (Value **)&local_f0.map_);
            }
            else {
              pVVar4->map_ = (ObjectValues *)local_f0;
              piVar1 = &(this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            bVar8 = readValue(this);
            std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                      ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
            if (!bVar8) {
              recoverFromError(this,tokenObjectEnd);
              goto LAB_0010e861;
            }
            readToken(this,&local_a8);
            if ((local_a8.type_ < tokenError) && ((0x1404U >> (local_a8.type_ & 0x1f) & 1) != 0)) {
              while (local_a8.type_ == tokenComment) {
                readToken(this,&local_a8);
              }
              if (local_a8.type_ == tokenObjectEnd) goto LAB_0010e870;
              iVar9 = 0;
              goto LAB_0010e878;
            }
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
            addError(this,(string *)&local_f0,&local_a8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \':\' after object member name","");
            addError(this,(string *)&local_f0,(Token *)&local_90,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0.string_);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_0010e861:
        iVar9 = 1;
        unaff_R13B = 0;
      }
    }
LAB_0010e878:
    if (iVar9 != 0) {
      if (iVar9 == 3) {
        local_f0.string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Missing \'}\' or object member name","");
        addError(this,(string *)&local_f0,&local_48,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0.string_);
        }
        unaff_R13B = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  currentValue() = Value(objectValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}